

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxu32 Systrcpy(char *zDest,sxu32 nDestLen,char *zSrc,sxu32 nLen)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *zEnd;
  uchar *zIn;
  uchar *zBuf;
  sxu32 nLen_local;
  char *zSrc_local;
  sxu32 nDestLen_local;
  char *zDest_local;
  
  zBuf._4_4_ = nLen;
  if (nLen == 0) {
    zBuf._4_4_ = SyStrlen(zSrc);
  }
  puVar1 = (uchar *)(zDest + (nDestLen - 1));
  zEnd = (uchar *)zSrc;
  zIn = (uchar *)zDest;
  for (; (puVar2 = zIn, zIn < puVar1 && (zBuf._4_4_ != 0)); zBuf._4_4_ = zBuf._4_4_ - 4) {
    *zIn = *zEnd;
    puVar2 = zIn + 1;
    if ((puVar1 <= puVar2) || (zBuf._4_4_ == 1)) break;
    *puVar2 = zEnd[1];
    puVar2 = zIn + 2;
    if ((puVar1 <= puVar2) || (zBuf._4_4_ == 2)) break;
    *puVar2 = zEnd[2];
    puVar2 = zIn + 3;
    if ((puVar1 <= puVar2) || (zBuf._4_4_ == 3)) break;
    *puVar2 = zEnd[3];
    zEnd = zEnd + 4;
    zIn = zIn + 4;
  }
  zIn = puVar2;
  *zIn = '\0';
  return (int)zIn - (int)zDest;
}

Assistant:

JX9_PRIVATE sxu32 Systrcpy(char *zDest, sxu32 nDestLen, const char *zSrc, sxu32 nLen)
{
	unsigned char *zBuf = (unsigned char *)zDest;
	unsigned char *zIn = (unsigned char *)zSrc;
	unsigned char *zEnd;
#if defined(UNTRUST)
	if( zSrc == (const char *)zDest ){
			return 0;
	}
#endif
	if( nLen <= 0 ){
		nLen = SyStrlen(zSrc);
	}
	zEnd = &zBuf[nDestLen - 1]; /* reserve a room for the null terminator */
	for(;;){
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
	}
	zBuf[0] = 0;
	return (sxu32)(zBuf-(unsigned char *)zDest);
}